

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionObservationHistoryTree.cpp
# Opt level: O0

ActionObservationHistoryTree * __thiscall
ActionObservationHistoryTree::GetSuccessor(ActionObservationHistoryTree *this,Index aI,Index oI)

{
  undefined8 uVar1;
  ActionObservationHistoryTree *pAVar2;
  long in_RDI;
  EInvalidIndex *e;
  ActionObservationHistoryTree *suc;
  char *in_stack_ffffffffffffffd8;
  TreeNode<ActionObservationHistory> *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RDI + 0x58) == 1) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E((E *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  TreeNode<ActionObservationHistory>::GetSuccessor
            (in_stack_ffffffffffffffe0,(LIndex)in_stack_ffffffffffffffd8);
  pAVar2 = (ActionObservationHistoryTree *)
           TreeNode<ActionObservationHistory>::GetSuccessor
                     (in_stack_ffffffffffffffe0,(LIndex)in_stack_ffffffffffffffd8);
  return pAVar2;
}

Assistant:

ActionObservationHistoryTree* ActionObservationHistoryTree::GetSuccessor(Index 
        aI, Index oI)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, ActionObservationHistoryTree* suc)  on O_SUC node");

    ActionObservationHistoryTree* suc;
    try {
        suc = (ActionObservationHistoryTree*)
        //we only put ActionObservationHistoryTree*'s in here so this cast
        //should be allowed.
        this->TreeNode<ActionObservationHistory>::GetSuccessor(aI) //the oNode
        ->TreeNode<ActionObservationHistory>::GetSuccessor(oI);
    } catch(EInvalidIndex& e) {
        // successor does not exist, so we should create it, see
        // JointActionObservationHistoryTree::GetSuccessor for
        // inspiration
        throw(E("ActionObservationHistoryTree::GetSuccessor generation of successors on the fly not yet implemented"));
    }

    return(suc);
}